

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

str __thiscall
pybind11::str::format<pybind11::object&,pybind11::handle_const&>
          (str *this,object *args,handle *args_1)

{
  object oStack_38;
  object local_30;
  PyObject *local_28;
  char *local_20;
  object local_18;
  
  local_28 = (args->super_handle).m_ptr;
  local_20 = "format";
  local_18.super_handle.m_ptr = (handle)(PyObject *)0x0;
  detail::object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
  operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
              *)&oStack_38,&local_30,args_1);
  str(this,&oStack_38);
  object::~object(&oStack_38);
  object::~object(&local_18);
  return (object)(object)this;
}

Assistant:

str format(Args &&...args) const {
        return attr("format")(std::forward<Args>(args)...);
    }